

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,int,int,duckdb::BinaryStandardOperatorWrapper,duckdb::GetBitOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  int *piVar1;
  int iVar2;
  string_t input;
  
  duckdb::Vector::SetVectorType((VectorType)result);
  piVar1 = *(int **)(result + 0x20);
  if (((*(byte **)(left + 0x28) == (byte *)0x0) || ((**(byte **)(left + 0x28) & 1) != 0)) &&
     ((*(byte **)(right + 0x28) == (byte *)0x0 || ((**(byte **)(right + 0x28) & 1) != 0)))) {
    input.value._8_4_ = **(undefined4 **)(right + 0x20);
    input.value._0_8_ = (*(undefined8 **)(left + 0x20))[1];
    input.value._12_4_ = 0;
    iVar2 = GetBitOperator::Operation<duckdb::string_t,int,int>
                      ((GetBitOperator *)**(undefined8 **)(left + 0x20),input,
                       (int)*(undefined4 **)(right + 0x20));
    *piVar1 = iVar2;
    return;
  }
  duckdb::ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}